

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O1

void wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::scan
               (ExnrefLocalAssigner *self,Expression **currp)

{
  Expression *pEVar1;
  TargetTryLabelScanner *pTVar2;
  const_iterator cVar3;
  
  pEVar1 = *currp;
  if (pEVar1->_id == TryId) {
    pTVar2 = self->labelScanner;
    cVar3 = std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::find(&(pTVar2->rethrowTargets)._M_t,(key_type *)(pEVar1 + 1));
    if ((_Rb_tree_header *)cVar3._M_node !=
        &(pTVar2->rethrowTargets)._M_t._M_impl.super__Rb_tree_header) {
      Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                  *)self,decrementRethrowTryDepth,currp);
    }
  }
  PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  ::scan(self,currp);
  if (pEVar1->_id == TryId) {
    pTVar2 = self->labelScanner;
    cVar3 = std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::find(&(pTVar2->rethrowTargets)._M_t,(key_type *)(pEVar1 + 1));
    if ((_Rb_tree_header *)cVar3._M_node !=
        &(pTVar2->rethrowTargets)._M_t._M_impl.super__Rb_tree_header) {
      Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                  *)self,incrementRethrowTryDepth,currp);
      return;
    }
  }
  return;
}

Assistant:

static void scan(ExnrefLocalAssigner* self, Expression** currp) {
      auto* curr = *currp;
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(decrementRethrowTryDepth, currp);
        }
      }
      PostWalker<ExnrefLocalAssigner>::scan(self, currp);
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(incrementRethrowTryDepth, currp);
        }
      }
    }